

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.h
# Opt level: O0

void pbrt::Error<char_const*,char_const*>(char *fmt,char **args,char **args_1)

{
  char *in_stack_ffffffffffffffa8;
  FileLoc *loc;
  char **in_stack_ffffffffffffffc8;
  char **in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  
  loc = (FileLoc *)&stack0xffffffffffffffc8;
  StringPrintf<char_const*,char_const*>
            (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  std::__cxx11::string::c_str();
  Error(loc,in_stack_ffffffffffffffa8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  return;
}

Assistant:

inline void Error(const char *fmt, Args &&... args) {
    Error(nullptr, StringPrintf(fmt, std::forward<Args>(args)...).c_str());
}